

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O3

int kex_agree_mac(LIBSSH2_SESSION *session,libssh2_endpoint_data *endpoint,uchar *mac,size_t mac_len
                 )

{
  LIBSSH2_MAC_METHOD **methodlist;
  LIBSSH2_MAC_METHOD *pLVar1;
  char *pcVar2;
  uchar *puVar3;
  int iVar4;
  _func_int_LIBSSH2_SESSION_ptr_uchar_ptr_uint_uchar_ptr_uint_uchar_ptr_ptr_uint_ptr_char_ptr_void_ptr_ptr
  *needle;
  size_t sVar5;
  
  methodlist = _libssh2_mac_methods();
  pLVar1 = _libssh2_mac_override((LIBSSH2_CRYPT_METHOD *)session->free);
  if (pLVar1 == (LIBSSH2_MAC_METHOD *)0x0) {
    needle = session->agentSignCallback;
    if (needle == (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_uint_uchar_ptr_uint_uchar_ptr_ptr_uint_ptr_char_ptr_void_ptr_ptr
                   *)0x0) {
      iVar4 = -1;
      pLVar1 = *methodlist;
      while (pLVar1 != (LIBSSH2_MAC_METHOD *)0x0) {
        methodlist = methodlist + 1;
        puVar3 = (uchar *)pLVar1->name;
        if (puVar3 == (uchar *)0x0) {
          return -1;
        }
        sVar5 = strlen((char *)puVar3);
        puVar3 = _libssh2_kex_agree_instr((uchar *)endpoint,(size_t)mac,puVar3,sVar5);
        if (puVar3 != (uchar *)0x0) goto LAB_00114992;
        pLVar1 = *methodlist;
      }
    }
    else {
      iVar4 = -1;
      do {
        if (*needle ==
            (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_uint_uchar_ptr_uint_uchar_ptr_ptr_uint_ptr_char_ptr_void_ptr_ptr
             )0x0) {
          return -1;
        }
        pcVar2 = strchr((char *)needle,0x2c);
        if (pcVar2 == (char *)0x0) {
          sVar5 = strlen((char *)needle);
        }
        else {
          sVar5 = (long)pcVar2 - (long)needle;
        }
        puVar3 = _libssh2_kex_agree_instr((uchar *)endpoint,(size_t)mac,(uchar *)needle,sVar5);
        if (puVar3 != (uchar *)0x0) {
          pLVar1 = (LIBSSH2_MAC_METHOD *)
                   kex_get_method_by_name((char *)needle,sVar5,(LIBSSH2_COMMON_METHOD **)methodlist)
          ;
          if (pLVar1 == (LIBSSH2_MAC_METHOD *)0x0) {
            return -1;
          }
          goto LAB_00114992;
        }
        needle = (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_uint_uchar_ptr_uint_uchar_ptr_ptr_uint_ptr_char_ptr_void_ptr_ptr
                  *)(pcVar2 + 1);
      } while (pcVar2 != (char *)0x0);
    }
  }
  else {
LAB_00114992:
    session->ssh_msg_debug =
         (_func_void_LIBSSH2_SESSION_ptr_int_char_ptr_int_char_ptr_int_void_ptr_ptr *)pLVar1;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

static int kex_agree_mac(LIBSSH2_SESSION * session,
                         libssh2_endpoint_data * endpoint, unsigned char *mac,
                         size_t mac_len)
{
    const LIBSSH2_MAC_METHOD **macp = _libssh2_mac_methods();
    const LIBSSH2_MAC_METHOD *override;
    unsigned char *s;
    (void)session;

    override = _libssh2_mac_override(endpoint->crypt);
    if(override) {
        /* This crypto method has its own hmac method built-in, so a separate
         * negotiation (and use) of a separate hmac method is unnecessary */
        endpoint->mac = override;
        return 0;
    }

    if(endpoint->mac_prefs) {
        s = (unsigned char *) endpoint->mac_prefs;

        while(s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));

            if(_libssh2_kex_agree_instr(mac, mac_len, s, method_len)) {
                const LIBSSH2_MAC_METHOD *method = (const LIBSSH2_MAC_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           macp);

                if(!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                endpoint->mac = method;
                return 0;
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while(*macp && (*macp)->name) {
        s = _libssh2_kex_agree_instr(mac, mac_len,
                                     (unsigned char *) (*macp)->name,
                                     strlen((*macp)->name));
        if(s) {
            endpoint->mac = *macp;
            return 0;
        }
        macp++;
    }

    return -1;
}